

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError GropeDevice(snd_pcm_t *pcm,int isPlug,StreamDirection mode,int openBlocking,
                   PaAlsaDeviceInfo *devInfo)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  snd_pcm_hw_params_t *hwParams;
  PaError PVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uStack_90;
  snd_pcm_hw_params_t asStack_88 [8];
  long local_80;
  undefined1 local_78 [4];
  int local_74;
  int dir;
  ulong local_68;
  undefined4 local_5c;
  ulong uStack_58;
  uint minChans;
  snd_pcm_uframes_t alsaBufferFrames;
  snd_pcm_uframes_t alsaPeriodFrames;
  double dStack_40;
  uint maxChans;
  PaError local_34;
  
  uVar7 = CONCAT44(in_register_0000000c,openBlocking);
  hwParams = asStack_88;
  local_74 = isPlug;
  if (pcm == (snd_pcm_t *)0x0) {
    uStack_90 = 0x10bea0;
    __assert_fail("pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x34f,
                  "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)")
    ;
  }
  dStack_40 = *(double *)(uVar7 + 0x40);
  _dir = CONCAT71(stack0xffffffffffffff91,mode != StreamDirection_In);
  PVar8 = 0;
  uStack_90 = 0x10ba42;
  iVar3 = snd_pcm_nonblock();
  if (iVar3 < 0) {
    uStack_90 = 0x10bdbe;
    GropeDevice_cold_1();
    PVar8 = -9999;
  }
  else {
    uStack_90 = 0x10ba5b;
    __n = snd_pcm_hw_params_sizeof();
    lVar6 = -(__n + 0xf & 0xfffffffffffffff0);
    hwParams = asStack_88 + lVar6;
    *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10ba79;
    memset(hwParams,0,__n);
    *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10ba84;
    snd_pcm_hw_params_any(pcm,hwParams);
    dVar9 = dStack_40;
    if (0.0 <= dStack_40) {
      *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10ba9e;
      iVar3 = SetApproximateSampleRate(pcm,hwParams,dVar9);
      dVar9 = dStack_40;
      if (iVar3 < 0) {
        *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bab6;
        snd_pcm_hw_params_any(pcm,hwParams);
        dVar9 = -1.0;
      }
    }
    if (dVar9 < 0.0) {
      local_34 = 0;
      local_5c = 0xac44;
      bVar2 = false;
      local_68 = uVar7;
      dStack_40 = dVar9;
      *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10baf5;
      snd_pcm_hw_params_set_rate_resample(pcm,hwParams,0);
      *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bb05;
      iVar3 = snd_pcm_hw_params_set_rate_near(pcm,hwParams,&local_5c,0);
      PVar8 = -9999;
      dVar9 = dStack_40;
      if (-1 < iVar3) {
        alsaBufferFrames = CONCAT44(alsaBufferFrames._4_4_,1);
        *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bb2d;
        iVar3 = snd_pcm_hw_params_get_rate_numden
                          (hwParams,&stack0xffffffffffffffa8,&alsaBufferFrames);
        dVar9 = (double)(uStack_58 & 0xffffffff) / (double)(alsaBufferFrames & 0xffffffff);
        bVar2 = true;
        PVar8 = local_34;
        if (iVar3 < 0) {
          dStack_40 = dVar9;
          *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bdfd;
          GropeDevice_cold_2();
          bVar2 = false;
          PVar8 = -9999;
          dVar9 = dStack_40;
        }
      }
      uVar7 = local_68;
      if (!bVar2) goto LAB_0010bd9c;
    }
    dStack_40 = dVar9;
    local_34 = PVar8;
    *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bb89;
    iVar3 = snd_pcm_hw_params_get_channels_min(hwParams,&local_5c);
    if (iVar3 < 0) {
      *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bdd1;
      GropeDevice_cold_3();
    }
    else {
      *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bba9;
      iVar3 = snd_pcm_hw_params_get_channels_max(hwParams,(long)&alsaPeriodFrames + 4);
      if (iVar3 < 0) {
        *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bde5;
        GropeDevice_cold_4();
      }
      else {
        uVar1 = (uint)(byte)dir;
        uVar4 = (_dir & 0xff) * 8;
        local_80 = (ulong)(uVar1 * 4) + 0x54;
        local_68 = uVar4 | 0x30;
        if ((int)alsaPeriodFrames._4_4_ < 0) {
          *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bebf;
          __assert_fail("maxChans <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                        ,899,
                        "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                       );
        }
        if (alsaPeriodFrames._4_4_ == 0) {
          *(code **)(asStack_88 + lVar6 + -8) = SetApproximateSampleRate;
          __assert_fail("maxChans > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                        ,900,
                        "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                       );
        }
        if (0x80 < alsaPeriodFrames._4_4_ && local_74 != 0) {
          alsaPeriodFrames._4_4_ = 0x80;
        }
        uStack_58 = 0x200;
        alsaBufferFrames = 0x80;
        _dir = uVar4 + 0x20;
        *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bc36;
        iVar3 = snd_pcm_hw_params_set_buffer_size_near(pcm,hwParams);
        if (iVar3 < 0) {
          *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10be12;
          GropeDevice_cold_5();
        }
        else {
          *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bc5d;
          iVar3 = snd_pcm_hw_params_set_period_size_near(pcm,hwParams,&alsaBufferFrames,local_78);
          if (iVar3 < 0) {
            *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10be26;
            GropeDevice_cold_6();
          }
          else {
            lVar5 = uStack_58 - alsaBufferFrames;
            auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
            auVar10._0_8_ = lVar5;
            auVar10._12_4_ = 0x45300000;
            *(double *)(uVar7 + _dir) =
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / dStack_40;
            uStack_58 = 0x800;
            alsaBufferFrames = 0x200;
            *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bcc4;
            iVar3 = snd_pcm_hw_params_any(pcm,hwParams);
            dVar9 = dStack_40;
            if (iVar3 < 0) {
              *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10be3a;
              GropeDevice_cold_7();
            }
            else {
              *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bce8;
              iVar3 = SetApproximateSampleRate(pcm,hwParams,dVar9);
              if (iVar3 < 0) {
                *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10be4e;
                GropeDevice_cold_8();
              }
              else {
                *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bd0b;
                iVar3 = snd_pcm_hw_params_set_buffer_size_near
                                  (pcm,hwParams,&stack0xffffffffffffffa8);
                if (-1 < iVar3) {
                  *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10bd2e;
                  iVar3 = snd_pcm_hw_params_set_period_size_near
                                    (pcm,hwParams,&alsaBufferFrames,local_78);
                  if (iVar3 < 0) {
                    *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10be76;
                    GropeDevice_cold_10();
                    PVar8 = -9999;
                  }
                  else {
                    lVar6 = uStack_58 - alsaBufferFrames;
                    auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
                    auVar11._0_8_ = lVar6;
                    auVar11._12_4_ = 0x45300000;
                    *(double *)(uVar7 + local_68) =
                         ((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / dStack_40
                    ;
                    *(undefined4 *)(uVar7 + local_80) = local_5c;
                    *(uint *)(uVar7 + (ulong)(uVar1 * 4) + 0x14) = alsaPeriodFrames._4_4_;
                    *(double *)(uVar7 + 0x40) = dStack_40;
                    PVar8 = local_34;
                  }
                  goto LAB_0010bd9c;
                }
                *(undefined8 *)(asStack_88 + lVar6 + -8) = 0x10be62;
                GropeDevice_cold_9();
              }
            }
          }
        }
      }
    }
    local_34 = -9999;
    PVar8 = -9999;
  }
LAB_0010bd9c:
  *(undefined8 *)(hwParams + -8) = 0x10bda4;
  snd_pcm_close(pcm);
  return PVar8;
}

Assistant:

static PaError GropeDevice( snd_pcm_t* pcm, int isPlug, StreamDirection mode, int openBlocking,
        PaAlsaDeviceInfo* devInfo )
{
    PaError result = paNoError;
    snd_pcm_hw_params_t *hwParams;
    snd_pcm_uframes_t alsaBufferFrames, alsaPeriodFrames;
    unsigned int minChans, maxChans;
    int* minChannels, * maxChannels;
    double * defaultLowLatency, * defaultHighLatency, * defaultSampleRate =
        &devInfo->baseDeviceInfo.defaultSampleRate;
    double defaultSr = *defaultSampleRate;
    int dir;

    assert( pcm );

    PA_DEBUG(( "%s: collecting info ..\n", __FUNCTION__ ));

    if( StreamDirection_In == mode )
    {
        minChannels = &devInfo->minInputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxInputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowInputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighInputLatency;
    }
    else
    {
        minChannels = &devInfo->minOutputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxOutputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowOutputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighOutputLatency;
    }

    ENSURE_( alsa_snd_pcm_nonblock( pcm, 0 ), paUnanticipatedHostError );

    alsa_snd_pcm_hw_params_alloca( &hwParams );
    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( defaultSr >= 0 )
    {
        /* Could be that the device opened in one mode supports samplerates that the other mode wont have,
         * so try again .. */
        if( SetApproximateSampleRate( pcm, hwParams, defaultSr ) < 0 )
        {
            defaultSr = -1.;
            alsa_snd_pcm_hw_params_any( pcm, hwParams ); /* Clear any params (rate) that might have been set */
            PA_DEBUG(( "%s: Original default samplerate failed, trying again ..\n", __FUNCTION__ ));
        }
    }

    if( defaultSr < 0. )           /* Default sample rate not set */
    {
        unsigned int sampleRate = 44100;        /* Will contain approximate rate returned by alsa-lib */

        /* Don't allow rate resampling when probing for the default rate (but ignore if this call fails) */
        alsa_snd_pcm_hw_params_set_rate_resample( pcm, hwParams, 0 );
        if( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &sampleRate, NULL ) < 0 )
        {
            result = paUnanticipatedHostError;
            goto error;
        }
        ENSURE_( GetExactSampleRate( hwParams, &defaultSr ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans ), paUnanticipatedHostError );
    assert( maxChans <= INT_MAX );
    assert( maxChans > 0 );    /* Weird linking issue could cause wrong version of ALSA symbols to be called,
                                   resulting in zeroed values */

    /* XXX: Limit to sensible number (ALSA plugins accept a crazy amount of channels)? */
    if( isPlug && maxChans > 128 )
    {
        maxChans = 128;
        PA_DEBUG(( "%s: Limiting number of plugin channels to %u\n", __FUNCTION__, maxChans ));
    }

    /* TWEAKME:
     * Giving values for default min and max latency is not straightforward.
     *  * for low latency, we want to give the lowest value that will work reliably.
     *      This varies based on the sound card, kernel, CPU, etc.  Better to give
     *      sub-optimal latency than to give a number too low and cause dropouts.
     *  * for high latency we want to give a large enough value that dropouts are basically impossible.
     *      This doesn't really require as much tweaking, since providing too large a number will
     *      just cause us to select the nearest setting that will work at stream config time.
     */
    /* Try low latency values, (sometimes the buffer & period that result are larger) */
    alsaBufferFrames = 512;
    alsaPeriodFrames = 128;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultLowLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    /* Base the high latency case on values four times larger */
    alsaBufferFrames = 2048;
    alsaPeriodFrames = 512;
    /* Have to reset hwParams, to set new buffer size; need to also set sample rate again */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );
    ENSURE_( SetApproximateSampleRate( pcm, hwParams, defaultSr ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultHighLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    *minChannels = (int)minChans;
    *maxChannels = (int)maxChans;
    *defaultSampleRate = defaultSr;

end:
    alsa_snd_pcm_close( pcm );
    return result;

error:
    goto end;
}